

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_matrix.c
# Opt level: O0

int gdAffineConcat(double *dst,double *m1,double *m2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dst5;
  double dst4;
  double dst3;
  double dst2;
  double dst1;
  double dst0;
  double *m2_local;
  double *m1_local;
  double *dst_local;
  
  dVar1 = *m1;
  dVar2 = m2[1];
  dVar3 = m1[1];
  dVar4 = m2[3];
  dVar5 = m1[2];
  dVar6 = *m2;
  dVar7 = m1[3];
  dVar8 = m2[2];
  dVar9 = m1[2];
  dVar10 = m2[1];
  dVar11 = m1[3];
  dVar12 = m2[3];
  dVar13 = m1[4];
  dVar14 = *m2;
  dVar15 = m1[5];
  dVar16 = m2[2];
  dVar17 = m2[4];
  dVar18 = m1[4];
  dVar19 = m2[1];
  dVar20 = m1[5];
  dVar21 = m2[3];
  dVar22 = m2[5];
  *dst = *m1 * *m2 + m1[1] * m2[2];
  dst[1] = dVar1 * dVar2 + dVar3 * dVar4;
  dst[2] = dVar5 * dVar6 + dVar7 * dVar8;
  dst[3] = dVar9 * dVar10 + dVar11 * dVar12;
  dst[4] = dVar13 * dVar14 + dVar15 * dVar16 + dVar17;
  dst[5] = dVar18 * dVar19 + dVar20 * dVar21 + dVar22;
  return 1;
}

Assistant:

BGD_DECLARE(int) gdAffineConcat (double dst[6], const double m1[6], const double m2[6])
{
	double dst0, dst1, dst2, dst3, dst4, dst5;

	dst0 = m1[0] * m2[0] + m1[1] * m2[2];
	dst1 = m1[0] * m2[1] + m1[1] * m2[3];
	dst2 = m1[2] * m2[0] + m1[3] * m2[2];
	dst3 = m1[2] * m2[1] + m1[3] * m2[3];
	dst4 = m1[4] * m2[0] + m1[5] * m2[2] + m2[4];
	dst5 = m1[4] * m2[1] + m1[5] * m2[3] + m2[5];
	dst[0] = dst0;
	dst[1] = dst1;
	dst[2] = dst2;
	dst[3] = dst3;
	dst[4] = dst4;
	dst[5] = dst5;
	return GD_TRUE;
}